

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.h
# Opt level: O0

size_t __thiscall
xmrig::Threads<xmrig::CudaThreads>::move
          (Threads<xmrig::CudaThreads> *this,char *profile,CudaThreads *threads)

{
  bool bVar1;
  size_t count;
  pair<const_xmrig::String,_xmrig::CudaThreads> *this_00;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  pair<const_xmrig::String,_xmrig::CudaThreads> *in_stack_ffffffffffffff80;
  Threads<xmrig::CudaThreads> *in_stack_ffffffffffffffa0;
  pair<const_xmrig::String,_xmrig::CudaThreads> local_50;
  size_t local_28;
  size_t local_8;
  
  bVar1 = has(in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    local_28 = CudaThreads::count((CudaThreads *)0x1f445f);
    bVar1 = CudaThreads::isEmpty((CudaThreads *)0x1f446e);
    if (!bVar1) {
      this_00 = &local_50;
      std::pair<const_xmrig::String,_xmrig::CudaThreads>::
      pair<const_char_*&,_xmrig::CudaThreads,_true>
                (in_stack_ffffffffffffff80,
                 (char **)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                 (CudaThreads *)this_00);
      std::
      map<xmrig::String,_xmrig::CudaThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
      ::insert((map<xmrig::String,_xmrig::CudaThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
                *)in_stack_ffffffffffffff80,
               (value_type *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      std::pair<const_xmrig::String,_xmrig::CudaThreads>::~pair(this_00);
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

inline size_t move(const char *profile, T &&threads)
    {
        if (has()) {
            return 0;
        }

        const size_t count = threads.count();

        if (!threads.isEmpty()) {
            m_profiles.insert({ profile, std::move(threads) });
        }

        return count;
    }